

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall
cmake::ReadListFile(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,string *path)

{
  bool bVar1;
  cmGlobalGenerator *this_00;
  string *psVar2;
  cmGlobalGenerator *globalGenerator;
  string file;
  cmStateSnapshot snapshot;
  cmMakefile mf;
  string local_858;
  cmStateSnapshot local_838;
  cmMakefile local_820;
  
  globalGenerator =
       (this->GlobalGenerator)._M_t.
       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  if (globalGenerator == (cmGlobalGenerator *)0x0) {
    this_00 = (cmGlobalGenerator *)operator_new(0x6f0);
    cmGlobalGenerator::cmGlobalGenerator(this_00,this);
    globalGenerator = this_00;
  }
  else {
    this_00 = (cmGlobalGenerator *)0x0;
  }
  if (path->_M_string_length != 0) {
    cmState::Reset((cmStateSnapshot *)&local_820,
                   (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                   _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    (this->CurrentSnapshot).Position.Position =
         (PositionType)
         local_820.FindPackageRootPathStack.
         super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur;
    (this->CurrentSnapshot).State =
         (cmState *)
         local_820.FindPackageRootPathStack.
         super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Deque_impl_data._M_map;
    (this->CurrentSnapshot).Position.Tree =
         (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
         local_820.FindPackageRootPathStack.
         super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size;
    local_838.Position.Position = (this->CurrentSnapshot).Position.Position;
    local_838.State = (this->CurrentSnapshot).State;
    local_838.Position.Tree = (this->CurrentSnapshot).Position.Tree;
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_820,&local_838);
    psVar2 = cmState::GetBinaryDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&local_820,psVar2);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_820,&local_838);
    psVar2 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    cmStateDirectory::SetCurrentSource((cmStateDirectory *)&local_820,psVar2);
    cmStateSnapshot::SetDefaultDefinitions(&local_838);
    cmMakefile::cmMakefile(&local_820,globalGenerator,&local_838);
    if (this->CurrentWorkingMode != NORMAL_MODE) {
      cmsys::SystemTools::CollapseFullPath(&local_858,path);
      cmsys::SystemTools::ConvertToUnixSlashes(&local_858);
      cmMakefile::SetScriptModeFile(&local_820,&local_858);
      cmMakefile::SetArgcArgv(&local_820,args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_858._M_dataplus._M_p != &local_858.field_2) {
        operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
      }
    }
    bVar1 = cmMakefile::ReadListFile(&local_820,path);
    if (!bVar1) {
      std::operator+(&local_858,"Error processing file: ",path);
      cmSystemTools::Error(&local_858);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_858._M_dataplus._M_p != &local_858.field_2) {
        operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
      }
    }
    cmMakefile::~cmMakefile(&local_820);
  }
  if (this_00 != (cmGlobalGenerator *)0x0) {
    (*this_00->_vptr_cmGlobalGenerator[1])(this_00);
  }
  return;
}

Assistant:

void cmake::ReadListFile(const std::vector<std::string>& args,
                         const std::string& path)
{
  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator* gg = this->GetGlobalGenerator();

  // if a generator was not specified use a generic one
  std::unique_ptr<cmGlobalGenerator> gen;
  if (!gg) {
    gen = cm::make_unique<cmGlobalGenerator>(this);
    gg = gen.get();
  }

  // read in the list file to fill the cache
  if (!path.empty()) {
    this->CurrentSnapshot = this->State->Reset();
    cmStateSnapshot snapshot = this->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentBinary(this->GetHomeOutputDirectory());
    snapshot.GetDirectory().SetCurrentSource(this->GetHomeDirectory());
    snapshot.SetDefaultDefinitions();
    cmMakefile mf(gg, snapshot);
    if (this->GetWorkingMode() != NORMAL_MODE) {
      std::string file(cmSystemTools::CollapseFullPath(path));
      cmSystemTools::ConvertToUnixSlashes(file);
      mf.SetScriptModeFile(file);

      mf.SetArgcArgv(args);
    }
    if (!mf.ReadListFile(path)) {
      cmSystemTools::Error("Error processing file: " + path);
    }
  }
}